

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::do_actual_learning_oaa(ldf *data,single_learner *base,multi_ex *ec_seq)

{
  pointer ppeVar1;
  example *peVar2;
  wclass *pwVar3;
  size_t sVar4;
  uint64_t uVar5;
  wclass *pwVar6;
  wclass *pwVar7;
  example **example;
  pointer ppeVar8;
  iterator __begin1;
  pointer ppeVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppeVar9 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = -3.4028235e+38;
  fVar14 = 3.4028235e+38;
  for (ppeVar8 = ppeVar9; ppeVar8 != ppeVar1; ppeVar8 = ppeVar8 + 1) {
    fVar10 = (((*ppeVar8)->l).cs.costs._begin)->x;
    fVar12 = fVar10;
    if (fVar14 <= fVar10) {
      fVar12 = fVar14;
    }
    if (fVar10 <= fVar13) {
      fVar10 = fVar13;
    }
    fVar13 = fVar10;
    fVar14 = fVar12;
  }
  for (; ppeVar9 != ppeVar1; ppeVar9 = ppeVar9 + 1) {
    peVar2 = *ppeVar9;
    pwVar3 = (peVar2->l).cs.costs._begin;
    sVar4 = (peVar2->l).cs.costs.erase_count;
    pwVar6 = (peVar2->l).cs.costs._end;
    pwVar7 = (peVar2->l).cs.costs.end_array;
    fVar10 = peVar2->weight;
    fVar12 = pwVar3->x;
    if (data->treat_as_classifier == true) {
      fVar11 = fVar12;
      if (fVar14 >= fVar12) {
        fVar11 = fVar13;
      }
      peVar2->weight = (fVar11 - fVar14) * fVar10;
      fVar12 = *(float *)(&DAT_0023b6d8 + (ulong)(fVar14 < fVar12) * 4);
    }
    peVar2 = *ppeVar9;
    (peVar2->l).simple.label = fVar12;
    (peVar2->l).simple.initial = 0.0;
    LabelDict::add_example_namespace_from_memory
              (&data->label_features,*ppeVar9,(ulong)pwVar3->class_index);
    uVar5 = ((*ppeVar9)->super_example_predict).ft_offset;
    ((*ppeVar9)->super_example_predict).ft_offset = data->ft_offset;
    LEARNER::learner<char,_example>::learn(base,*ppeVar9,0);
    ((*ppeVar9)->super_example_predict).ft_offset = uVar5;
    LabelDict::del_example_namespace_from_memory
              (&data->label_features,*ppeVar9,(ulong)pwVar3->class_index);
    (*ppeVar9)->weight = fVar10;
    peVar2 = *ppeVar9;
    (peVar2->l).cs.costs._begin = pwVar3;
    (peVar2->l).cs.costs._end = pwVar6;
    (peVar2->l).cs.costs.end_array = pwVar7;
    (peVar2->l).cs.costs.erase_count = sVar4;
    (*ppeVar9)->partial_prediction = pwVar3->partial_prediction;
  }
  return;
}

Assistant:

void do_actual_learning_oaa(ldf& data, single_learner& base, multi_ex& ec_seq)
{
  float min_cost = FLT_MAX;
  float max_cost = -FLT_MAX;

  for (const auto & example : ec_seq)
  {
    float ec_cost = example->l.cs.costs[0].x;
    if (ec_cost < min_cost)
      min_cost = ec_cost;
    if (ec_cost > max_cost)
      max_cost = ec_cost;
  }

  for (const auto & ec : ec_seq)
  {
    // save original variables
    label save_cs_label = ec->l.cs;
    v_array<COST_SENSITIVE::wclass> costs = save_cs_label.costs;

    // build example for the base learner
    label_data simple_label;

    simple_label.initial = 0.;
    float old_weight = ec->weight;
    if (!data.treat_as_classifier)  // treat like regression
      simple_label.label = costs[0].x;
    else  // treat like classification
    {
      if (costs[0].x <= min_cost)
      {
        simple_label.label = -1.;
        ec->weight = old_weight * (max_cost - min_cost);
      }
      else
      {
        simple_label.label = 1.;
        ec->weight = old_weight * (costs[0].x - min_cost);
      }
    }
    ec->l.simple = simple_label;

    // learn
    LabelDict::add_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    uint64_t old_offset = ec->ft_offset;
    ec->ft_offset = data.ft_offset;
    base.learn(*ec);
    ec->ft_offset = old_offset;
    LabelDict::del_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    ec->weight = old_weight;

    // restore original cost-sensitive label, sum of importance weights and partial_prediction
    ec->l.cs = save_cs_label;
    ec->partial_prediction = costs[0].partial_prediction;
  }
}